

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_StageSetup(ARKodeMem ark_mem,int implicit)

{
  ARKodeARKStepMem step_mem_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  int in_ESI;
  void *in_RDI;
  N_Vector *Xvecs;
  realtype *cvals;
  int nvec;
  int j;
  int i;
  int retval;
  ARKodeARKStepMem step_mem;
  N_Vector in_stack_ffffffffffffffb8;
  realtype in_stack_ffffffffffffffc0;
  N_Vector *X;
  N_Vector x;
  uint in_stack_ffffffffffffffd4;
  int local_4;
  
  if (*(long *)((long)in_RDI + 0xe8) == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ARKStep","arkStep_StageSetup",
                    "Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    step_mem_00 = *(ARKodeARKStepMem *)((long)in_RDI + 0xe8);
    iVar1 = step_mem_00->istage;
    if ((in_ESI == 0) && (iVar1 == 0)) {
      N_VConst(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      local_4 = 0;
    }
    else {
      x = (N_Vector)step_mem_00->cvals;
      X = step_mem_00->Xvecs;
      if (in_ESI != 0) {
        step_mem_00->gamma = *(double *)((long)in_RDI + 0x168) * step_mem_00->Bi->A[iVar1][iVar1];
        if (*(int *)((long)in_RDI + 0x25c) != 0) {
          step_mem_00->gammap = step_mem_00->gamma;
        }
        if (*(int *)((long)in_RDI + 0x25c) == 0) {
          in_stack_ffffffffffffffb8 = (N_Vector)(step_mem_00->gamma / step_mem_00->gammap);
        }
        else {
          in_stack_ffffffffffffffb8 = (N_Vector)&DAT_3ff0000000000000;
        }
        step_mem_00->gamrat = (realtype)in_stack_ffffffffffffffb8;
      }
      if ((in_ESI == 0) || (step_mem_00->predictor != 5)) {
        if (in_ESI != 0) {
          N_VLinearSum((realtype)((ulong)in_stack_ffffffffffffffd4 << 0x20),x,(realtype)X,
                       in_stack_ffffffffffffffb8,(N_Vector)0xe8e586);
          x->content = (void *)0x3ff0000000000000;
          *X = step_mem_00->sdata;
        }
        uVar3 = (uint)(in_ESI != 0);
        if ((in_ESI != 0) && (step_mem_00->mass_type == 1)) {
          N_VScale((realtype)X,in_stack_ffffffffffffffb8,(N_Vector)0xe8e5e7);
          iVar2 = (*step_mem_00->mmult)
                            (in_RDI,*(N_Vector *)((long)in_RDI + 0x120),step_mem_00->sdata);
          if (iVar2 != 0) {
            return -0x12;
          }
        }
        if (step_mem_00->explicit != 0) {
          for (in_stack_ffffffffffffffd4 = 0; (int)in_stack_ffffffffffffffd4 < iVar1;
              in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
            (&x->content)[(int)uVar3] =
                 (void *)(*(double *)((long)in_RDI + 0x168) *
                         step_mem_00->Be->A[iVar1][(int)in_stack_ffffffffffffffd4]);
            X[(int)uVar3] = step_mem_00->Fe[(int)in_stack_ffffffffffffffd4];
            uVar3 = uVar3 + 1;
          }
        }
        if (step_mem_00->implicit != 0) {
          for (in_stack_ffffffffffffffd4 = 0; (int)in_stack_ffffffffffffffd4 < iVar1;
              in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
            (&x->content)[(int)uVar3] =
                 (void *)(*(double *)((long)in_RDI + 0x168) *
                         step_mem_00->Bi->A[iVar1][(int)in_stack_ffffffffffffffd4]);
            X[(int)uVar3] = step_mem_00->Fi[(int)in_stack_ffffffffffffffd4];
            uVar3 = uVar3 + 1;
          }
        }
        if (step_mem_00->impforcing != 0) {
          arkStep_ApplyForcing
                    (step_mem_00,*(realtype *)((long)in_RDI + 0x198),
                     *(double *)((long)in_RDI + 0x168) * step_mem_00->Bi->A[iVar1][iVar1],
                     (int *)&stack0xffffffffffffffd0);
        }
        iVar1 = N_VLinearCombination
                          (in_stack_ffffffffffffffd4,(realtype *)x,X,in_stack_ffffffffffffffb8);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          local_4 = -0x1c;
        }
      }
      else {
        if (step_mem_00->impforcing == 0) {
          N_VConst((realtype)X,in_stack_ffffffffffffffb8);
        }
        else {
          arkStep_ApplyForcing
                    (step_mem_00,*(realtype *)((long)in_RDI + 0x198),step_mem_00->gamma,
                     (int *)&stack0xffffffffffffffd0);
          iVar1 = N_VLinearCombination
                            (in_stack_ffffffffffffffd4,(realtype *)x,X,in_stack_ffffffffffffffb8);
          if (iVar1 != 0) {
            return -0x1c;
          }
        }
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int arkStep_StageSetup(ARKodeMem ark_mem, booleantype implicit)
{
  /* local data */
  ARKodeARKStepMem step_mem;
  int retval, i, j, nvec;
  realtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_StageSetup", MSG_ARKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem) ark_mem->step_mem;

  /* Set shortcut to current stage index */
  i = step_mem->istage;

  /* If this is the first stage, and explicit, just set sdata=0 and return */
  if (!implicit && (i==0)) {
    N_VConst(ZERO, step_mem->sdata);
    return (ARK_SUCCESS);
  }

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* Update gamma if stage is implicit */
  if (implicit) {
    step_mem->gamma = ark_mem->h * step_mem->Bi->A[i][i];
    if (ark_mem->firststage)
      step_mem->gammap = step_mem->gamma;
    step_mem->gamrat = (ark_mem->firststage) ?
      ONE : step_mem->gamma / step_mem->gammap;  /* protect x/x != 1.0 */
  }

  /* If predictor==5, then sdata=0 (plus any implicit forcing).
     Set sdata appropriately and return */
  if (implicit && (step_mem->predictor == 5)) {

    /* apply external polynomial forcing (updates nvec, cvals, Xvecs) */
    if (step_mem->impforcing) {
      nvec = 0;
      arkStep_ApplyForcing(step_mem, ark_mem->tcur, step_mem->gamma, &nvec);
      retval = N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
      if (retval != 0) return(ARK_VECTOROP_ERR);
    } else {
      N_VConst(ZERO, step_mem->sdata);
    }
    return (ARK_SUCCESS);

  }

  /* If implicit, initialize sdata to yn - zpred (here: zpred = zp), and set
     first entries for eventual N_VLinearCombination call */
  nvec = 0;
  if (implicit) {
    N_VLinearSum(ONE, ark_mem->yn, -ONE, step_mem->zpred, step_mem->sdata);
    cvals[0] = ONE;
    Xvecs[0] = step_mem->sdata;
    nvec = 1;
  }

  /* If implicit with fixed M!=I, update sdata with M*sdata */
  if (implicit && (step_mem->mass_type == MASS_FIXED)) {
    N_VScale(ONE, step_mem->sdata, ark_mem->tempv1);
    retval = step_mem->mmult((void *) ark_mem, ark_mem->tempv1, step_mem->sdata);
    if (retval != ARK_SUCCESS)  return (ARK_MASSMULT_FAIL);
  }

  /* Update sdata with prior stage information */
  if (step_mem->explicit) {   /* Explicit pieces */
    for (j=0; j<i; j++) {
      cvals[nvec] = ark_mem->h * step_mem->Be->A[i][j];
      Xvecs[nvec] = step_mem->Fe[j];
      nvec += 1;
    }
  }
  if (step_mem->implicit) {   /* Implicit pieces */
    for (j=0; j<i; j++) {
      cvals[nvec] = ark_mem->h * step_mem->Bi->A[i][j];
      Xvecs[nvec] = step_mem->Fi[j];
      nvec += 1;
    }
  }

  /* apply external polynomial forcing (updates nvec, cvals, Xvecs) */
  if (step_mem->impforcing) {
    arkStep_ApplyForcing(step_mem, ark_mem->tcur,
                         ark_mem->h * step_mem->Bi->A[i][i], &nvec);
  }

  /* call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
  if (retval != 0) return(ARK_VECTOROP_ERR);

  /* return with success */
  return (ARK_SUCCESS);
}